

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeWebAssemblyMemoryPrototype
               (DynamicObject *prototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined8 in_RAX;
  uint uVar2;
  JavascriptString *pJVar1;
  JavascriptMethod entryPoint;
  JavascriptFunction *function;
  ulong uVar3;
  
  uVar2 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,prototype,mode,4,0);
  this = (((prototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar3 = (ulong)uVar2 << 0x20;
  (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (prototype,0x67,(this->webAssemblyMemoryConstructor).ptr,6,0,0,uVar3);
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar1 = CreateStringFromCppLiteral<19ul>(this,(char16 (*) [19])0xfff00e);
    (*(prototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(prototype,0x1b,pJVar1,2,0,0,uVar3 & 0xffffffff00000000);
  }
  entryPoint = FunctionInfo::GetOriginalEntryPoint
                         ((FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow);
  function = AddFunctionToLibraryObject
                       (this,prototype,0xe4,(FunctionInfo *)WebAssemblyMemory::EntryInfo::Grow,1,
                        '\x06');
  ScriptContext::SetBuiltInLibraryFunction(this_00,entryPoint,function);
  AddAccessorsToLibraryObject
            (this,prototype,0x1aa,(FunctionInfo *)WebAssemblyMemory::EntryInfo::GetterBuffer,
             (FunctionInfo *)0x0);
  DynamicObject::SetHasNoEnumerableProperties(prototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyMemoryPrototype(DynamicObject* prototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(prototype, mode, 4);

        JavascriptLibrary* library = prototype->GetLibrary();
        ScriptContext* scriptContext = prototype->GetScriptContext();

        library->AddMember(prototype, PropertyIds::constructor, library->webAssemblyMemoryConstructor);
        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(prototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WebAssembly.Memory")), PropertyConfigurable);
        }
        scriptContext->SetBuiltInLibraryFunction(WebAssemblyMemory::EntryInfo::Grow.GetOriginalEntryPoint(),
            library->AddFunctionToLibraryObject(prototype, PropertyIds::grow, &WebAssemblyMemory::EntryInfo::Grow, 1));

        library->AddAccessorsToLibraryObject(prototype, PropertyIds::buffer, &WebAssemblyMemory::EntryInfo::GetterBuffer, nullptr);

        prototype->SetHasNoEnumerableProperties(true);

        return true;
    }